

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidierror.cpp
# Opt level: O2

int anon_unknown.dwarf_1fa79::RtMidiError_getmessage(lua_State *L)

{
  RtMidiError *pRVar1;
  string *psVar2;
  string msg;
  
  pRVar1 = getRtMidiError(L,1);
  psVar2 = (string *)(**(code **)(*(long *)pRVar1 + 0x28))(pRVar1);
  std::__cxx11::string::string((string *)&msg,psVar2);
  lua_pushlstring(L,msg._M_dataplus._M_p,msg._M_string_length);
  std::__cxx11::string::~string((string *)&msg);
  return 1;
}

Assistant:

int RtMidiError_getmessage(lua_State *L) {
	auto &self = getRtMidiError(L, 1);
	auto msg = self.getMessage();
	lua_pushlstring(L, msg.c_str(), msg.size());
	return 1;
}